

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

ParseStatus __thiscall HTTPRequest::parse(HTTPRequest *this)

{
  int iVar1;
  undefined8 *puVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  allocator local_71;
  undefined1 local_70 [32];
  string local_50;
  
  switch(this->status) {
  case WAITING_REQUEST_LINE:
    ReadBuffer::get_line(&this->buffer);
    if ((char *)local_70._8_8_ == (char *)0x0) {
      return PARSE_FAILED;
    }
    parse_request_line(this,(char *)local_70._8_8_,local_70._0_8_);
    this->status = WAITING_HEADER;
  case WAITING_HEADER:
    while( true ) {
      ReadBuffer::get_line(&this->buffer);
      if ((char *)local_70._8_8_ == (char *)0x0) {
        return PARSE_FAILED;
      }
      if ((pointer)local_70._0_8_ == (pointer)0x0) break;
      iVar1 = parse_header_line(this,(char *)local_70._8_8_,local_70._0_8_);
      if (iVar1 != 0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = "ErrorParseHeader";
        __cxa_throw(puVar2,&char_const*::typeinfo,0);
      }
    }
    std::__cxx11::string::string((string *)local_70,"Content-Length",&local_71);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->header)._M_t,(key_type *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->header)._M_t._M_impl.super__Rb_tree_header) {
      uVar9 = 0;
      lVar7 = 0x98;
    }
    else {
      std::__cxx11::string::string((string *)local_70,"Content-Length",&local_71);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->header,(key_type *)local_70);
      std::__cxx11::string::string((string *)(local_70 + 0x20),(string *)pmVar4);
      sVar5 = string_to_size_t((string *)(local_70 + 0x20));
      this->content_length = sVar5;
      std::__cxx11::string::~string((string *)(local_70 + 0x20));
      std::__cxx11::string::~string((string *)local_70);
      if (this->content != (char *)0x0) {
        operator_delete(this->content);
        this->content = (char *)0x0;
      }
      uVar9 = this->content_length;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (long)uVar9) {
        uVar8 = uVar9;
      }
      pcVar6 = (char *)operator_new__(uVar8);
      this->content = pcVar6;
      lVar7 = 200;
    }
    *(undefined8 *)((long)&(this->method)._M_dataplus._M_p + lVar7) = 0;
    this->status = WAITING_CONTENT;
    break;
  case WAITING_CONTENT:
    uVar9 = this->content_length;
    break;
  case GET_A_REQUEST:
    goto switchD_0010647b_caseD_3;
  default:
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/http_request.cpp"
            ,0x4f);
    fprintf(_stderr,"--> %s\n","false");
    perror("info");
    exit(1);
  }
  if ((uVar9 != 0) && (uVar9 != this->content_received)) {
    ReadBuffer::get_chars((ReadBuffer *)local_70,(ssize_t)&this->buffer);
    if ((char *)local_70._8_8_ == (char *)0x0) {
      return PARSE_FAILED;
    }
    memcpy(this->content + this->content_received,(void *)local_70._8_8_,local_70._0_8_);
    lVar7 = this->content_received;
    this->content_received = (ssize_t)(local_70._0_8_ + lVar7);
    if ((pointer)(local_70._0_8_ + lVar7) != (pointer)this->content_length) {
      return PARSE_FAILED;
    }
  }
  this->status = GET_A_REQUEST;
switchD_0010647b_caseD_3:
  return PARSE_NEW_REQUEST;
}

Assistant:

ParseStatus HTTPRequest::parse() {
    const char *str;
    ssize_t size;
    switch (this->status) {
        case WAITING_REQUEST_LINE:
            IF_FALSE_EXIT(this->status == WAITING_REQUEST_LINE);
            std::tie(str, size) = this->buffer.get_line();
            if (str == nullptr) return PARSE_FAILED;
            if (this->parse_request_line(str, size) != 0) throw "ErrorParseRequestLine";
            this->status = WAITING_HEADER;
        case WAITING_HEADER:
            IF_FALSE_EXIT(this->status == WAITING_HEADER);
            while (1) {
                std::tie(str, size) = this->buffer.get_line();
                if (str == nullptr) return PARSE_FAILED;
                if (size != 0) {
                    if (this->parse_header_line(str, size) != 0) throw "ErrorParseHeader";
                } else {
                    if (this->header.find("Content-Length") != this->header.end()) {
                        this->content_length = string_to_size_t(this->header["Content-Length"]);
                        if (this->content != nullptr) {
                            delete this->content;
                            this->content = nullptr;
                        }
                        this->content = new char[this->content_length];
                        this->content_received = 0;
                    } else {
                        this->content_length = 0;
                    }
                    this->status = WAITING_CONTENT;
                    break;
                }
            }
        case WAITING_CONTENT:
            IF_FALSE_EXIT(this->status == WAITING_CONTENT);
            if (this->content_length == 0 || this->content_length == this->content_received) {
                this->status = GET_A_REQUEST;
            } else {
                std::tie(str, size) = this->buffer.get_chars(this->content_length - this->content_received);
                if (str == nullptr) return PARSE_FAILED;
                memcpy(this->content + this->content_received, str, size * sizeof(char));
                this->content_received += size;
                if (this->content_received == this->content_length) {
                    this->status = GET_A_REQUEST;
                } else {
                    return PARSE_FAILED;
                }
            }
        case GET_A_REQUEST:
            IF_FALSE_EXIT(this->status == GET_A_REQUEST);
            return PARSE_NEW_REQUEST;
        default:
            IF_FALSE_EXIT(false);
    }
}